

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

xcb_generic_iterator_t
xcb_input_feedback_state_data_string_keysyms_end
          (xcb_input_feedback_state_t *R,xcb_input_feedback_state_data_t *S)

{
  void *pvVar1;
  xcb_generic_iterator_t xVar2;
  long lVar3;
  long in_RSI;
  long in_FS_OFFSET;
  xcb_generic_iterator_t i;
  undefined4 local_28;
  undefined4 local_18;
  
  pvVar1 = (void *)(*(long *)(in_RSI + 0x40) + (ulong)*(ushort *)(in_RSI + 0x3a) * 4);
  local_18 = (int)pvVar1;
  local_28 = (int)in_RSI;
  lVar3 = (ulong)(uint)(local_18 - local_28) << 0x20;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    xVar2.rem = (int)lVar3;
    xVar2.index = (int)((ulong)lVar3 >> 0x20);
    xVar2.data = pvVar1;
    return xVar2;
  }
  __stack_chk_fail();
}

Assistant:

xcb_generic_iterator_t
xcb_input_feedback_state_data_string_keysyms_end (const xcb_input_feedback_state_t *R,
                                                  const xcb_input_feedback_state_data_t *S)
{
    xcb_generic_iterator_t i;
    i.data = S->string.keysyms + S->string.num_keysyms;
    i.rem = 0;
    i.index = (char *) i.data - (char *) S;
    return i;
}